

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  long lVar1;
  EXRVersion *pEVar2;
  char **ppcVar3;
  pointer pHVar4;
  bool bVar5;
  undefined4 in_EAX;
  int iVar6;
  char *pcVar7;
  pointer pTVar8;
  char *pcVar9;
  EXRHeader **ppEVar10;
  EXRHeader *exr_header;
  pointer pHVar11;
  undefined8 uVar12;
  long lVar13;
  uchar *buf;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  bool empty_header;
  string err_str;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  HeaderInfo info;
  bool local_17d;
  int local_17c;
  EXRVersion *local_178;
  string local_170;
  char **local_150;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_148;
  EXRHeader ***local_130;
  int *local_128;
  size_t local_120;
  undefined1 local_118 [16];
  TChannelInfo local_108;
  int local_b4;
  uint local_9c;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  char *local_50 [2];
  char local_40 [16];
  
  auVar17._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar17._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar17._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar17._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar6 = movmskps(in_EAX,auVar17);
  if (iVar6 == 0) {
    if (size < 8) {
      local_118._0_8_ = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Data size too short","");
      uVar12 = local_118._0_8_;
      if (err != (char **)0x0) {
        pcVar7 = strdup((char *)local_118._0_8_);
        *err = pcVar7;
      }
      if ((TChannelInfo *)uVar12 != &local_108) {
        operator_delete((void *)uVar12);
      }
      local_17c = -4;
    }
    else {
      buf = memory + 8;
      local_120 = size - 8;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178 = exr_version;
      local_150 = err;
      local_130 = exr_headers;
      local_128 = num_headers;
      do {
        local_108.name.field_2._M_allocated_capacity = 0;
        local_108.name.field_2._8_8_ = 0;
        local_108.name._M_dataplus._M_p = (pointer)0x0;
        local_108.name._M_string_length = 0;
        local_118._0_8_ = (TChannelInfo *)0x0;
        local_118._8_8_ = (pointer)0x0;
        local_90._M_p = (pointer)&local_80;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        tinyexr::HeaderInfo::clear((HeaderInfo *)local_118);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        local_170._M_string_length = 0;
        local_170.field_2._M_local_buf[0] = '\0';
        local_17d = false;
        iVar6 = tinyexr::ParseEXRHeader
                          ((HeaderInfo *)local_118,&local_17d,exr_version,&local_170,buf,local_120);
        if (iVar6 == 0) {
          if (local_17d == true) {
            buf = buf + 1;
            iVar15 = 2;
            exr_version = local_178;
            iVar6 = local_17c;
          }
          else if (local_b4 == 0) {
            if (local_108.name.field_2._M_allocated_capacity != local_108.name._M_string_length) {
              lVar13 = 0x200;
              uVar16 = 0;
              pTVar8 = (pointer)local_108.name._M_string_length;
              uVar12 = local_108.name.field_2._M_allocated_capacity;
              do {
                if (*(void **)(pTVar8->name + lVar13) != (void *)0x0) {
                  free(*(void **)(pTVar8->name + lVar13));
                  pTVar8 = (pointer)local_108.name._M_string_length;
                  uVar12 = local_108.name.field_2._M_allocated_capacity;
                }
                uVar16 = uVar16 + 1;
                lVar13 = lVar13 + 0x210;
              } while (uVar16 < (ulong)((uVar12 - (long)pTVar8 >> 4) * 0xf83e0f83e0f83e1));
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"`chunkCount\' attribute is not found in the header.","");
            pcVar7 = local_50[0];
            ppcVar3 = local_150;
            exr_version = local_178;
            if (local_150 != (char **)0x0) {
              pcVar9 = strdup(local_50[0]);
              *ppcVar3 = pcVar9;
            }
            if (pcVar7 != local_40) {
              operator_delete(pcVar7);
            }
            local_17c = -4;
            iVar15 = 1;
            iVar6 = local_17c;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      (&local_148,(HeaderInfo *)local_118);
            buf = buf + local_9c;
            iVar15 = 0;
            exr_version = local_178;
            iVar6 = local_17c;
          }
        }
        else {
          if (local_108.name.field_2._M_allocated_capacity != local_108.name._M_string_length) {
            lVar13 = 0x200;
            uVar16 = 0;
            pTVar8 = (pointer)local_108.name._M_string_length;
            uVar12 = local_108.name.field_2._M_allocated_capacity;
            do {
              if (*(void **)(pTVar8->name + lVar13) != (void *)0x0) {
                free(*(void **)(pTVar8->name + lVar13));
                pTVar8 = (pointer)local_108.name._M_string_length;
                uVar12 = local_108.name.field_2._M_allocated_capacity;
              }
              uVar16 = uVar16 + 1;
              lVar13 = lVar13 + 0x210;
            } while (uVar16 < (ulong)((uVar12 - (long)pTVar8 >> 4) * 0xf83e0f83e0f83e1));
          }
          ppcVar3 = local_150;
          iVar15 = 1;
          exr_version = local_178;
          if (local_150 != (char **)0x0) {
            pcVar7 = strdup(local_170._M_dataplus._M_p);
            *ppcVar3 = pcVar7;
            exr_version = local_178;
          }
        }
        local_17c = iVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p);
        }
        if ((pointer)local_108.name._M_string_length != (pointer)0x0) {
          operator_delete((void *)local_108.name._M_string_length);
        }
        std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::~vector
                  ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                   local_118);
        pHVar4 = local_148.
                 super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pHVar11 = local_148.
                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (iVar15 == 0);
      if (iVar15 == 2) {
        lVar13 = (long)local_148.
                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_148.
                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar16 = lVar13 * -0x70a3d70a3d70a3d7;
        ppEVar10 = (EXRHeader **)malloc(lVar13 * 0x7ae147ae147ae148);
        *local_130 = ppEVar10;
        if (pHVar4 == pHVar11) {
          local_17c = 0;
        }
        else {
          uVar14 = 0;
          local_17c = 0;
          do {
            exr_header = (EXRHeader *)calloc(1,0x188);
            local_118._0_8_ = &local_108;
            local_118._8_8_ = (pointer)0x0;
            local_108.name._M_dataplus._M_p = local_108.name._M_dataplus._M_p & 0xffffffffffffff00;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            local_170._M_string_length = 0;
            local_170.field_2._M_local_buf[0] = '\0';
            bVar5 = tinyexr::ConvertHeader
                              (exr_header,pHVar11 + uVar14,(string *)local_118,&local_170);
            pEVar2 = local_178;
            if (!bVar5) {
              pTVar8 = local_148.
                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].attributes.
                       super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (local_148.
                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14].attributes.
                  super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                  super__Vector_impl_data._M_finish != pTVar8) {
                pHVar11 = local_148.
                          super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar13 = uVar14 * 200 + 0xe8;
                do {
                  if (pTVar8->value != (uchar *)0x0) {
                    free(pTVar8->value);
                    pHVar11 = local_148.
                              super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  uVar14 = uVar14 + 1;
                  pTVar8 = *(pointer *)((long)pHVar11->screen_window_center + lVar13 + -0x5c);
                  lVar1 = lVar13 + -0x54;
                  lVar13 = lVar13 + 200;
                } while (*(pointer *)((long)pHVar11->screen_window_center + lVar1) != pTVar8);
              }
              if (local_150 == (char **)0x0) {
                local_17c = -9;
              }
              else {
                local_17c = -9;
                if (local_170._M_string_length != 0) {
                  pcVar7 = strdup(local_170._M_dataplus._M_p);
                  *local_150 = pcVar7;
                }
              }
            }
            exr_header->multipart = (uint)(pEVar2->multipart != 0);
            (*local_130)[uVar14] = exr_header;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            if ((TChannelInfo *)local_118._0_8_ != &local_108) {
              operator_delete((void *)local_118._0_8_);
            }
            uVar14 = uVar14 + 1;
            uVar16 = ((long)local_148.
                            super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
            pHVar11 = local_148.
                      super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar14 < uVar16);
        }
        *local_128 = (int)uVar16;
      }
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&local_148);
    }
  }
  else {
    local_118._0_8_ = &local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"Invalid argument for ParseEXRMultipartHeaderFromMemory","");
    uVar12 = local_118._0_8_;
    if (err != (char **)0x0) {
      pcVar7 = strdup((char *)local_118._0_8_);
      *err = pcVar7;
    }
    if ((TChannelInfo *)uVar12 != &local_108) {
      operator_delete((void *)uVar12);
    }
    local_17c = -3;
  }
  return local_17c;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {

      // Free malloc-allocated memory here.
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }

      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));

  
  int retcode = TINYEXR_SUCCESS;

  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));
    memset(exr_header, 0, sizeof(EXRHeader));

    std::string warn;
    std::string _err;
    if (!ConvertHeader(exr_header, infos[i], &warn, &_err)) {

      // Free malloc-allocated memory here.
      for (size_t k = 0; k < infos[i].attributes.size(); i++) {
        if (infos[i].attributes[k].value) {
          free(infos[i].attributes[k].value);
        }
      }

      if (!_err.empty()) {
        tinyexr::SetErrorMessage(
            _err, err);
      }
      // continue to converting headers
      retcode = TINYEXR_ERROR_INVALID_HEADER;
    }

    exr_header->multipart = exr_version->multipart ? 1 : 0;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return retcode;
}